

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::
DelayedDestructorSingleThread<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~DelayedDestructorSingleThread
          (DelayedDestructorSingleThread<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  bool bVar1;
  int local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  int local_14;
  DelayedDestructorSingleThread<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pDStack_10;
  int ii;
  DelayedDestructorSingleThread<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_14 = 0;
  pDStack_10 = this;
  do {
    do {
      bVar1 = std::
              vector<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->ElementsToBeDestroyed);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00145464:
        std::
        function<void_(std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
        ::~function(&this->callBeforeDeleteFunction);
        std::
        vector<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&this->ElementsToBeDestroyed);
        return;
      }
      local_14 = local_14 + 1;
      destroyObjects(this);
      bVar1 = std::
              vector<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->ElementsToBeDestroyed);
    } while (bVar1);
    if (4 < local_14) {
      destroyObjects(this);
      goto LAB_00145464;
    }
    if (local_14 % 2 == 0) {
      local_24 = 100;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
    }
    else {
      std::this_thread::yield();
    }
  } while( true );
}

Assistant:

~DelayedDestructorSingleThread()
    {
        try {
            int ii = 0;
            while (!ElementsToBeDestroyed.empty()) {
                ++ii;
                destroyObjects();
                if (!ElementsToBeDestroyed.empty()) {
#ifdef ENABLE_TRIPWIRE
                    // short circuit if the tripline was triggered
                    if (tripDetect.isTripped()) {
                        return;
                    }
#endif
                    if (ii > 4) {
                        destroyObjects();
                        break;
                    }
                    if (ii % 2 == 0) {
                        std::this_thread::sleep_for(
                            std::chrono::milliseconds(100));
                    } else {
                        std::this_thread::yield();
                    }
                }
            }
        }
        catch (...) {
        }
    }